

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  uint uVar1;
  element_type eVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  dxt1_block *this_00;
  uint y;
  uint uVar6;
  uint e;
  int iVar7;
  ulong uVar8;
  element tmp [2];
  
  iVar5 = ~x + this->m_blocks_x;
  for (uVar6 = 0; uVar6 < this->m_blocks_y; uVar6 = uVar6 + 1) {
    for (uVar8 = 0; uVar1 = this->m_num_elements_per_block, uVar8 < uVar1; uVar8 = uVar8 + 1) {
      iVar3 = this->m_blocks_x * uVar6;
      iVar7 = (int)uVar8;
      tmp[0].m_bytes = *&this->m_pElements[(x + iVar3) * uVar1 + iVar7].m_bytes;
      tmp[1].m_bytes = *&this->m_pElements[(iVar3 + iVar5) * uVar1 + iVar7].m_bytes;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
        eVar2 = this->m_element_type[uVar8];
        this_00 = (dxt1_block *)(tmp[0].m_bytes + lVar4);
        if (eVar2 == cAlphaDXT5) {
          dxt5_block::flip_x((dxt5_block *)this_00,4,4);
        }
        else if (eVar2 == cAlphaDXT3) {
          dxt3_block::flip_x((dxt3_block *)this_00,4,4);
        }
        else if (eVar2 == cColorDXT1) {
          dxt1_block::flip_x(this_00,4,4);
        }
      }
      *&this->m_pElements[(this->m_blocks_x * uVar6 + x) * this->m_num_elements_per_block + iVar7].
        m_bytes = tmp[1].m_bytes;
      *&this->m_pElements
        [(this->m_blocks_x * uVar6 + iVar5) * this->m_num_elements_per_block + iVar7].m_bytes =
           tmp[0].m_bytes;
    }
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x)
    {
        const uint other_x = (m_blocks_x - 1) - x;
        for (uint y = 0; y < m_blocks_y; y++)
        {
            for (uint e = 0; e < get_elements_per_block(); e++)
            {
                element tmp[2] = { get_element(x, y, e), get_element(other_x, y, e) };

                for (uint i = 0; i < 2; i++)
                {
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                }

                get_element(x, y, e) = tmp[1];
                get_element(other_x, y, e) = tmp[0];
            }
        }
    }